

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O0

void __thiscall
stackjit::AssemblyImageGenerator::generateFunctionBody
          (AssemblyImageGenerator *this,BinaryData *data,Function *function)

{
  bool bVar1;
  InstructionFormats IVar2;
  OpCodes value;
  char value_00;
  int value_01;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type sVar4;
  reference str;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar5;
  reference this_00;
  string *psVar6;
  reference pbVar7;
  float value_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parameter;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Instruction *instruction;
  iterator __end1_1;
  iterator __begin1_1;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Function *function_local;
  BinaryData *data_local;
  AssemblyImageGenerator *this_local;
  
  attributes = Loader::Function::attributes_abi_cxx11_(function);
  generateAttributes(this,data,attributes);
  pvVar3 = Loader::Function::localTypes_abi_cxx11_(function);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar3);
  anon_unknown_3::addData<unsigned_long>(data,sVar4);
  pvVar3 = Loader::Function::localTypes_abi_cxx11_(function);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar3);
  local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    anon_unknown_3::addString(data,str);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar5 = Loader::Function::instructions(function);
  sVar4 = std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::size(pvVar5);
  anon_unknown_3::addData<unsigned_long>(data,sVar4);
  pvVar5 = Loader::Function::instructions(function);
  __end1_1 = std::
             vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
             begin(pvVar5);
  instruction = (Instruction *)
                std::
                vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                ::end(pvVar5);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
                             *)&instruction), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
              ::operator*(&__end1_1);
    IVar2 = Loader::Instruction::format(this_00);
    anon_unknown_3::addData<char>(data,IVar2);
    value = Loader::Instruction::opCode(this_00);
    anon_unknown_3::addData<unsigned_char>(data,value);
    IVar2 = Loader::Instruction::format(this_00);
    switch(IVar2) {
    case OpCodeOnly:
      break;
    case IntData:
      value_01 = Loader::Instruction::intValue(this_00);
      anon_unknown_3::addData<int>(data,value_01);
      break;
    case FloatData:
      value_02 = Loader::Instruction::floatValue(this_00);
      anon_unknown_3::addData<float>(data,value_02);
      break;
    case CharData:
      value_00 = Loader::Instruction::charValue(this_00);
      anon_unknown_3::addData<char>(data,value_00);
      break;
    case StringData:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
      anon_unknown_3::addString(data,psVar6);
      break;
    case StringConstantData:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
      anon_unknown_3::addString(data,psVar6);
      break;
    case Call:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
      anon_unknown_3::addString(data,psVar6);
      pvVar3 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar3);
      anon_unknown_3::addData<unsigned_long>(data,sVar4);
      pvVar3 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
      param = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(pvVar3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&param), bVar1) {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        anon_unknown_3::addString(data,pbVar7);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      break;
    case CallInstance:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
      anon_unknown_3::addString(data,psVar6);
      psVar6 = Loader::Instruction::calledClassType_abi_cxx11_(this_00);
      anon_unknown_3::addString(data,psVar6);
      pvVar3 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar3);
      anon_unknown_3::addData<unsigned_long>(data,sVar4);
      pvVar3 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar3);
      parameter = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&parameter), bVar1) {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3_1);
        anon_unknown_3::addString(data,pbVar7);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<stackjit::Loader::Instruction_*,_std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateFunctionBody(BinaryData& data, Loader::Function& function) {
		//Attributes
		generateAttributes(data, function.attributes());

		//Locals
		addData<std::size_t>(data, function.localTypes().size());
		for (auto& local : function.localTypes()) {
			addString(data, local);
		}

		//Body
		addData<std::size_t>(data, function.instructions().size());

		for (auto& instruction : function.instructions()) {
			addData<char>(data, (char)instruction.format());
			addData<unsigned char>(data, (unsigned char)instruction.opCode());

			switch (instruction.format()) {
				case Loader::InstructionFormats::OpCodeOnly:
					break;
				case Loader::InstructionFormats::IntData:
					addData(data, instruction.intValue());
					break;
				case Loader::InstructionFormats::FloatData:
					addData(data, instruction.floatValue());
					break;
				case Loader::InstructionFormats::CharData:
					addData(data, instruction.charValue());
					break;
				case Loader::InstructionFormats::StringData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::StringConstantData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::Call:
					addString(data, instruction.stringValue());
					addData(data, instruction.callParameters().size());

					for (auto& param : instruction.callParameters()) {
						addString(data, param);
					}
					break;
				case Loader::InstructionFormats::CallInstance:
					addString(data, instruction.stringValue());
					addString(data, instruction.calledClassType());
					addData(data, instruction.callParameters().size());

					for (auto& parameter : instruction.callParameters()) {
						addString(data, parameter);
					}
					break;
			}
		}
	}